

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

int xmlRelaxNGDefaultTypeHave(void *data,xmlChar *type)

{
  int iVar1;
  uint uVar2;
  
  if (type != (xmlChar *)0x0) {
    iVar1 = xmlStrEqual(type,"string");
    uVar2 = 1;
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(type,(xmlChar *)"token");
      uVar2 = (uint)(iVar1 != 0);
    }
    return uVar2;
  }
  return -1;
}

Assistant:

static int
xmlRelaxNGDefaultTypeHave(void *data ATTRIBUTE_UNUSED,
                          const xmlChar * type)
{
    if (type == NULL)
        return (-1);
    if (xmlStrEqual(type, BAD_CAST "string"))
        return (1);
    if (xmlStrEqual(type, BAD_CAST "token"))
        return (1);
    return (0);
}